

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandTwoExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var_00;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  ulong local_80;
  ulong local_78;
  Bmc_EsPar_t local_70;
  undefined4 extraout_var;
  
  local_70.fVerbose = 0;
  local_70._52_4_ = 0;
  local_70.nLutSize = 2;
  local_70.nMajSupp = 0;
  local_70.fMajority = 0;
  local_70.fUseIncr = 0;
  local_70.fOnlyAnd = 0;
  local_70.fGlucose = 0;
  local_70.fOrderNodes = 0;
  local_70.fEnumSols = 0;
  local_78 = 0;
  Extra_UtilGetoptReset();
  uVar7 = 1;
  local_90 = 0;
  local_8c = 0;
  local_88 = 0;
  local_84 = 0;
  local_80 = 0;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"INTaogvh"), iVar6 = globalUtilOptind, iVar1 == 0x76
            ) {
        uVar7 = uVar7 ^ 1;
      }
      if (iVar1 < 0x54) break;
      if (iVar1 < 0x67) {
        if (iVar1 == 0x54) {
          if (argc <= globalUtilOptind) {
            pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
            goto LAB_00256233;
          }
          local_90 = atoi(argv[globalUtilOptind]);
          globalUtilOptind = iVar6 + 1;
          if ((int)local_90 < 0) goto LAB_0025623f;
        }
        else {
          if (iVar1 != 0x61) goto LAB_0025623f;
          local_8c = local_8c ^ 1;
        }
      }
      else if (iVar1 == 0x67) {
        local_84 = local_84 ^ 1;
      }
      else {
        if (iVar1 != 0x6f) goto LAB_0025623f;
        local_88 = local_88 ^ 1;
      }
    }
    if (iVar1 == -1) {
      local_70.fGlucose = local_84;
      local_70.fFewerVars = local_88;
      local_70.fOnlyAnd = local_8c;
      local_70.RuntimeLim = local_90;
      iVar6 = (int)local_78;
      local_70.fVerbose = uVar7;
      uVar7 = (uint)local_80;
      local_70.nVars = uVar7;
      local_70.nNodes = iVar6;
      if ((globalUtilOptind + 1 == argc) &&
         (local_70.pTtStr = argv[globalUtilOptind], local_70.pTtStr != (char *)0x0)) {
        uVar8 = 1 << ((char)local_80 - 2U & 0x1f);
        sVar3 = strlen(local_70.pTtStr);
        if (uVar8 != (uint)sVar3) {
          Abc_Print(-1,"Truth table is expected to have %d hex digits (instead of %d).\n",
                    (ulong)uVar8,sVar3);
          return 1;
        }
        if (iVar6 + 1U < uVar7) {
          Abc_Print(-1,"Function with %d variales cannot be implemented with %d two-input gates.\n",
                    local_80 & 0xffffffff,local_78 & 0xffffffff);
          return 1;
        }
        if (10 < uVar7) {
          Abc_Print(-1,"Function should not have more than 10 inputs.\n");
          return 1;
        }
        if (local_84 == 0) {
          Exa_ManExactSynthesis2(&local_70);
        }
        else {
          Exa_ManExactSynthesis(&local_70);
        }
        return 0;
      }
      pcVar4 = "Truth table should be given on the command line.\n";
      iVar6 = -1;
      goto LAB_002563d8;
    }
    if (iVar1 == 0x49) {
      if (globalUtilOptind < argc) {
        iVar1 = atoi(argv[globalUtilOptind]);
        uVar2 = CONCAT44(extraout_var_00,iVar1);
        local_80 = uVar2;
        goto LAB_00256113;
      }
      pcVar4 = "Command line switch \"-I\" should be followed by an integer.\n";
LAB_00256233:
      Abc_Print(-1,pcVar4);
      break;
    }
    if (iVar1 != 0x4e) break;
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
      goto LAB_00256233;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    uVar2 = CONCAT44(extraout_var,iVar1);
    local_78 = uVar2;
LAB_00256113:
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar2);
LAB_0025623f:
  Abc_Print(-2,"usage: twoexact [-INT <num>] [-aogvh] <hex>\n");
  Abc_Print(-2,"\t           exact synthesis of multi-input function using two-input gates\n");
  Abc_Print(-2,"\t-I <num> : the number of input variables [default = %d]\n",local_80);
  Abc_Print(-2,"\t-N <num> : the number of two-input nodes [default = %d]\n",local_78);
  Abc_Print(-2,"\t-T <num> : the runtime limit in seconds [default = %d]\n",(ulong)local_90);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (local_8c == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-a       : toggle using only AND-gates (without XOR-gates) [default = %s]\n",
            pcVar4);
  pcVar4 = "yes";
  if (local_88 == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-o       : toggle using additional optimizations [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_84 == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,
            "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
            ,pcVar4);
  if (uVar7 == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  Abc_Print(-2,"\t<hex>    : truth table in hex notation\n");
  Abc_Print(-2,"\t           \n");
  Abc_Print(-2,"\t           For example, command line \"twoexact -g -I 5 -N 12 169AE443\"\n");
  Abc_Print(-2,"\t           synthesizes the smallest circuit composed of two-input gates\n");
  Abc_Print(-2,"\t           for the only NPN class of 5-input functions that requires 12 gates;\n")
  ;
  Abc_Print(-2,"\t           all other functions can be realized with 11 two-input gates or less\n")
  ;
  Abc_Print(-2,
            "\t           (see Section 7.1.2 \"Boolean evaluation\" in the book by Donald Knuth\n");
  pcVar4 = "\t           http://www.cs.utsa.edu/~wagner/knuth/fasc0c.pdf)\n";
  iVar6 = -2;
LAB_002563d8:
  Abc_Print(iVar6,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandTwoExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Exa_ManExactSynthesis( Bmc_EsPar_t * pPars );
    extern void Exa_ManExactSynthesis2( Bmc_EsPar_t * pPars );
    int c;
    Bmc_EsPar_t Pars, * pPars = &Pars;
    Bmc_EsParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "INTaogvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVars < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodes < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->RuntimeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->RuntimeLim < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fOnlyAnd ^= 1;
            break;
        case 'o':
            pPars->fFewerVars ^= 1;
            break;
        case 'g':
            pPars->fGlucose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
        pPars->pTtStr = argv[globalUtilOptind];
    if ( pPars->pTtStr == NULL )
    {
        Abc_Print( -1, "Truth table should be given on the command line.\n" );
        return 1;
    }
    if ( (1 << (pPars->nVars-2)) != (int)strlen(pPars->pTtStr) )
    {
        Abc_Print( -1, "Truth table is expected to have %d hex digits (instead of %d).\n", (1 << (pPars->nVars-2)), strlen(pPars->pTtStr) );
        return 1;
    }
    if ( pPars->nVars > pPars->nNodes * (2 - 1) + 1 )
    {
        Abc_Print( -1, "Function with %d variales cannot be implemented with %d two-input gates.\n", pPars->nVars, pPars->nNodes );
        return 1;
    }
    if ( pPars->nVars > 10 )
    {
        Abc_Print( -1, "Function should not have more than 10 inputs.\n" );
        return 1;
    }
    if ( pPars->fGlucose )
        Exa_ManExactSynthesis( pPars );
    else
        Exa_ManExactSynthesis2( pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: twoexact [-INT <num>] [-aogvh] <hex>\n" );
    Abc_Print( -2, "\t           exact synthesis of multi-input function using two-input gates\n" );
    Abc_Print( -2, "\t-I <num> : the number of input variables [default = %d]\n", pPars->nVars );
    Abc_Print( -2, "\t-N <num> : the number of two-input nodes [default = %d]\n", pPars->nNodes );
    Abc_Print( -2, "\t-T <num> : the runtime limit in seconds [default = %d]\n", pPars->RuntimeLim );
    Abc_Print( -2, "\t-a       : toggle using only AND-gates (without XOR-gates) [default = %s]\n", pPars->fOnlyAnd ? "yes" : "no" );
    Abc_Print( -2, "\t-o       : toggle using additional optimizations [default = %s]\n", pPars->fFewerVars ? "yes" : "no" );
    Abc_Print( -2, "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", pPars->fGlucose ? "yes" : "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", pPars->fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t<hex>    : truth table in hex notation\n" );
    Abc_Print( -2, "\t           \n" );
    Abc_Print( -2, "\t           For example, command line \"twoexact -g -I 5 -N 12 169AE443\"\n" );
    Abc_Print( -2, "\t           synthesizes the smallest circuit composed of two-input gates\n" );
    Abc_Print( -2, "\t           for the only NPN class of 5-input functions that requires 12 gates;\n" );
    Abc_Print( -2, "\t           all other functions can be realized with 11 two-input gates or less\n" );
    Abc_Print( -2, "\t           (see Section 7.1.2 \"Boolean evaluation\" in the book by Donald Knuth\n" );
    Abc_Print( -2, "\t           http://www.cs.utsa.edu/~wagner/knuth/fasc0c.pdf)\n" );
    return 1;
}